

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O2

void verify_high_num_keeping_headers_param_test(void)

{
  FILE *pFVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  void *rvalue;
  char keybuf [16];
  size_t rvalue_len;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  
  memleak_start();
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  staleblktest* > errorlog.txt");
  fconfig.compaction_threshold = '\0';
  fconfig.num_keeping_headers = 100;
  fVar2 = fdb_open(&dbfile,"./staleblktest1",&fconfig);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1b2);
    verify_high_num_keeping_headers_param_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1b2,"void verify_high_num_keeping_headers_param_test()");
  }
  fVar2 = fdb_kvs_open(dbfile,&db,"num_keep",&kvs_config);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1b4);
    verify_high_num_keeping_headers_param_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1b4,"void verify_high_num_keeping_headers_param_test()");
  }
  uVar5 = 0;
  do {
    fVar2 = fdb_set_kv(db,"key",4,"val",4);
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1bd);
      verify_high_num_keeping_headers_param_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1bd,"void verify_high_num_keeping_headers_param_test()");
    }
    fVar2 = fdb_get_file_info(dbfile,&file_info);
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1c0);
      verify_high_num_keeping_headers_param_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1c0,"void verify_high_num_keeping_headers_param_test()");
    }
    uVar5 = uVar5 - 1;
  } while (file_info.file_size < 0x1000001);
  fVar2 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1c5);
    verify_high_num_keeping_headers_param_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1c5,"void verify_high_num_keeping_headers_param_test()");
  }
  uVar6 = 0;
  while (uVar6 != 100) {
    sprintf(keybuf,"key%d",(ulong)uVar6);
    handle = db;
    sVar3 = strlen(keybuf);
    fVar2 = fdb_set_kv(handle,keybuf,sVar3,"reu",4);
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1cc);
      verify_high_num_keeping_headers_param_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1cc,"void verify_high_num_keeping_headers_param_test()");
    }
    fVar2 = fdb_commit(dbfile,'\x01');
    pFVar1 = _stderr;
    uVar6 = uVar6 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1ce);
      verify_high_num_keeping_headers_param_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1ce,"void verify_high_num_keeping_headers_param_test()");
    }
  }
  uVar7 = uVar5 & 0xffffffff;
  while (uVar6 = (int)uVar7 + 1, uVar7 = (ulong)uVar6, uVar6 != 0) {
    fVar2 = fdb_set_kv(db,"key",4,"val",4);
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1d5);
      verify_high_num_keeping_headers_param_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1d5,"void verify_high_num_keeping_headers_param_test()");
    }
  }
  fVar2 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1d9);
    verify_high_num_keeping_headers_param_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1d9,"void verify_high_num_keeping_headers_param_test()");
  }
  fVar2 = fdb_snapshot_open(db,&snap_db,-uVar5);
  if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1dd);
    verify_high_num_keeping_headers_param_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_NO_DB_INSTANCE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1dd,"void verify_high_num_keeping_headers_param_test()");
  }
  fVar2 = fdb_snapshot_open(db,&snap_db,1 - uVar5);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1e2);
    verify_high_num_keeping_headers_param_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1e2,"void verify_high_num_keeping_headers_param_test()");
  }
  sVar3 = strlen(keybuf);
  fVar2 = fdb_get_kv(db,keybuf,sVar3,&rvalue,&rvalue_len);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1e5);
    verify_high_num_keeping_headers_param_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1e5,"void verify_high_num_keeping_headers_param_test()");
  }
  fVar2 = fdb_free_block(rvalue);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1e9);
    verify_high_num_keeping_headers_param_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1e9,"void verify_high_num_keeping_headers_param_test()");
  }
  fVar2 = fdb_kvs_close(snap_db);
  pFVar1 = _stderr;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_close(dbfile);
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x1ed);
      verify_high_num_keeping_headers_param_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x1ed,"void verify_high_num_keeping_headers_param_test()");
    }
    fVar2 = fdb_shutdown();
    pFVar1 = _stderr;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (verify_high_num_keeping_headers_param_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar4,"verify high num keeping headers param test");
      return;
    }
    pcVar4 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x1ef);
    verify_high_num_keeping_headers_param_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x1ef,"void verify_high_num_keeping_headers_param_test()");
  }
  pcVar4 = fdb_error_msg(fVar2);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x1eb);
  verify_high_num_keeping_headers_param_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x1eb,"void verify_high_num_keeping_headers_param_test()");
}

Assistant:

void verify_high_num_keeping_headers_param_test() {
    memleak_start();
    TEST_INIT();

    int i, r;
    int low_seq = 0;
    int nheaders=100;
    char keybuf[16];
    void *rvalue;
    size_t rvalue_len;

    fdb_file_handle* dbfile;
    fdb_kvs_handle* db;
    fdb_kvs_handle* snap_db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_info file_info;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;
    fconfig.num_keeping_headers = nheaders;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "num_keep", &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "val";

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    // create lowest commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    low_seq = i;

    // create 100 headers
    for (i = 0; i < nheaders; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // make sure all blocks up to kept headers are reused
    i = low_seq;
    while (--i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // -101 commit fail
    status = fdb_snapshot_open(db, &snap_db, low_seq);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    // -100 commit pass
    low_seq++;
    status = fdb_snapshot_open(db, &snap_db, low_seq);
    TEST_STATUS(status);

    status = fdb_get_kv(db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_STATUS(status);

    // cleanup
    status = fdb_free_block(rvalue);
    TEST_STATUS(status);
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    memleak_end();
    TEST_RESULT("verify high num keeping headers param test");
}